

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O2

void ProtectNoBanConnections
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  long lVar1;
  pointer pNVar2;
  NodeEvictionCandidate *pNVar3;
  long lVar4;
  NodeEvictionCandidate *pNVar5;
  long lVar6;
  const_iterator __first;
  NodeEvictionCandidate *pNVar7;
  NodeEvictionCandidate *pNVar8;
  const_iterator __last;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (eviction_candidates->
       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar6 = (long)__last._M_current - (long)pNVar2;
  pNVar5 = pNVar2 + 2;
  for (lVar4 = lVar6 / 0x48 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (pNVar5[-2].m_noban != false) {
      __first._M_current = pNVar5 + -2;
      goto LAB_00773c9b;
    }
    if (pNVar5[-1].m_noban != false) {
      __first._M_current = pNVar5 + -1;
      goto LAB_00773c9b;
    }
    __first._M_current = pNVar5;
    if (pNVar5->m_noban != false) goto LAB_00773c9b;
    if (pNVar5[1].m_noban != false) {
      __first._M_current = pNVar5 + 1;
      goto LAB_00773c9b;
    }
    pNVar5 = pNVar5 + 4;
    lVar6 = lVar6 + -0x120;
  }
  lVar6 = lVar6 / 0x48;
  pNVar7 = pNVar5 + -2;
  if (lVar6 == 1) {
LAB_00773d10:
    __first._M_current = pNVar7;
    if (pNVar7->m_noban == false) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar6 == 3) {
    __first._M_current = pNVar7;
    if (pNVar5[-2].m_noban == false) {
      pNVar7 = pNVar5 + -1;
      goto LAB_00773d05;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar6 != 2) goto LAB_00773cda;
LAB_00773d05:
    __first._M_current = pNVar7;
    if (pNVar7->m_noban == false) {
      pNVar7 = pNVar7 + 1;
      goto LAB_00773d10;
    }
  }
LAB_00773c9b:
  if (__first._M_current != __last._M_current) {
    pNVar5 = __first._M_current;
    while (pNVar7 = pNVar5 + 1, pNVar7 != __last._M_current) {
      pNVar3 = pNVar5 + 1;
      pNVar5 = pNVar7;
      lVar4 = 9;
      pNVar8 = __first._M_current;
      if (pNVar3->m_noban == false) {
        for (; lVar4 != 0; lVar4 = lVar4 + -1) {
          pNVar8->id = pNVar7->id;
          pNVar7 = (NodeEvictionCandidate *)&pNVar7->m_connected;
          pNVar8 = (NodeEvictionCandidate *)&pNVar8->m_connected;
        }
        __first._M_current = __first._M_current + 1;
      }
    }
    __last._M_current =
         (eviction_candidates->
         super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
LAB_00773cda:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::erase
            (eviction_candidates,__first,__last);
  return;
}

Assistant:

void ProtectNoBanConnections(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    eviction_candidates.erase(std::remove_if(eviction_candidates.begin(), eviction_candidates.end(),
                                             [](NodeEvictionCandidate const& n) {
                                                 return n.m_noban;
                                             }),
                              eviction_candidates.end());
}